

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O2

void __thiscall TPZFront<float>::TPZFront(TPZFront<float> *this,void **vtt,TPZFront<float> *cp)

{
  pointer ptVar1;
  pointer ptVar2;
  STensorProductMTData *pSVar3;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  this->fMaxFront = cp->fMaxFront;
  TPZManVector<long,_10>::TPZManVector(&this->fGlobal,&cp->fGlobal);
  TPZVec<long>::TPZVec(&this->fLocal,&cp->fLocal);
  this->fFront = cp->fFront;
  TPZStack<int,_10>::TPZStack(&this->fFree,&cp->fFree);
  TPZVec<float>::TPZVec(&this->fData,&cp->fData);
  this->fDecomposeType = cp->fDecomposeType;
  this->fNextRigidBodyMode = cp->fNextRigidBodyMode;
  this->fExpandRatio = cp->fExpandRatio;
  pSVar3 = cp->fProductMTData;
  if (pSVar3 == (STensorProductMTData *)0x0) {
    pSVar3 = (STensorProductMTData *)0x0;
  }
  else {
    ptVar1 = (pSVar3->fThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ptVar2 = (pSVar3->fThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pSVar3 = (STensorProductMTData *)operator_new(0x110);
    STensorProductMTData::STensorProductMTData
              (pSVar3,(int)((ulong)((long)ptVar2 - (long)ptVar1) >> 3),this);
  }
  this->fProductMTData = pSVar3;
  return;
}

Assistant:

TPZFront<TVar>::TPZFront(const TPZFront<TVar> &cp) : fMaxFront(cp.fMaxFront),
fGlobal(cp.fGlobal), fLocal(cp.fLocal),fFront(cp.fFront),fFree(cp.fFree),
fData(cp.fData),
fDecomposeType(cp.fDecomposeType)
{
	fNextRigidBodyMode = cp.fNextRigidBodyMode;
	fExpandRatio = cp.fExpandRatio;
	if (cp.fProductMTData) {
		const int nthreads = cp.fProductMTData->NThreads();
		this->fProductMTData = new STensorProductMTData(nthreads,this);
	}
	else {
		this->fProductMTData = NULL;
	}
}